

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elim.cpp
# Opt level: O0

void __thiscall
CaDiCaL::Internal::try_to_eliminate_variable
          (Internal *this,Eliminator *eliminator,int pivot,bool *deleted_binary_clause)

{
  bool bVar1;
  char cVar2;
  iterator this_00;
  iterator eliminator_00;
  Eliminator *eliminator_01;
  iterator this_01;
  iterator eliminator_02;
  undefined8 in_RCX;
  int in_EDX;
  Internal *in_RSI;
  Internal *in_RDI;
  Internal *unaff_retaddr;
  int in_stack_0000000c;
  Eliminator *in_stack_00000010;
  Internal *in_stack_00000018;
  Occs *ns;
  Occs *ps;
  int64_t neg;
  int64_t pos;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int lit;
  Internal *in_stack_ffffffffffffffb0;
  size_t local_30;
  size_t local_28;
  int pivot_00;
  undefined4 in_stack_ffffffffffffffe8;
  Internal *eliminator_03;
  
  pivot_00 = (int)((ulong)in_RCX >> 0x20);
  eliminator_03 = in_RDI;
  bVar1 = active((Internal *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (int)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    local_28 = flush_occs(unaff_retaddr,(int)((ulong)eliminator_03 >> 0x20));
    local_30 = flush_occs(unaff_retaddr,(int)((ulong)eliminator_03 >> 0x20));
    if ((long)local_30 < (long)local_28) {
      in_EDX = -in_EDX;
      std::swap<long>((long *)&local_28,(long *)&local_30);
    }
    if ((local_28 == 0) || ((long)local_30 <= (long)(in_RDI->opts).elimocclim)) {
      occs((Internal *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
           (int)((ulong)in_RDI >> 0x20));
      this_00 = std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::begin
                          ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)in_RDI);
      eliminator_00 =
           std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::end
                     ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)in_RDI);
      std::
      stable_sort<__gnu_cxx::__normal_iterator<CaDiCaL::Clause**,std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>>,CaDiCaL::clause_smaller_size>
                (this_00._M_current,eliminator_00._M_current);
      eliminator_01 =
           (Eliminator *)
           occs((Internal *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                (int)((ulong)in_RDI >> 0x20));
      this_01 = std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::begin
                          ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)in_RDI);
      eliminator_02 =
           std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::end
                     ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)in_RDI);
      std::
      stable_sort<__gnu_cxx::__normal_iterator<CaDiCaL::Clause**,std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>>,CaDiCaL::clause_smaller_size>
                (this_01._M_current,eliminator_02._M_current);
      if (local_28 != 0) {
        find_gate_clauses((Internal *)this_01._M_current,(Eliminator *)eliminator_02._M_current,
                          in_stack_ffffffffffffff94);
      }
      lit = (int)((ulong)eliminator_02._M_current >> 0x20);
      if ((((in_RDI->unsat & 1U) == 0) && (cVar2 = val(in_RDI,in_EDX), cVar2 == '\0')) &&
         (bVar1 = elim_resolvents_are_bounded(in_stack_00000018,in_stack_00000010,in_stack_0000000c)
         , bVar1)) {
        elim_add_resolvents(in_RSI,(Eliminator *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),pivot_00
                           );
        if ((in_RDI->unsat & 1U) == 0) {
          mark_eliminated_clauses_as_garbage
                    (unaff_retaddr,(Eliminator *)eliminator_03,(int)((ulong)in_RSI >> 0x20),
                     (bool *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
        }
        bVar1 = active((Internal *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (int)((ulong)in_RDI >> 0x20));
        if (bVar1) {
          mark_eliminated((Internal *)this_01._M_current,lit);
        }
      }
      unmark_gate_clauses(in_stack_ffffffffffffffb0,eliminator_01);
      elim_backward_clauses((Internal *)this_00._M_current,(Eliminator *)eliminator_00._M_current);
    }
  }
  return;
}

Assistant:

void Internal::try_to_eliminate_variable (Eliminator &eliminator, int pivot,
                                          bool &deleted_binary_clause) {

  if (!active (pivot))
    return;
  assert (!frozen (pivot));

  // First flush garbage clauses.
  //
  int64_t pos = flush_occs (pivot);
  int64_t neg = flush_occs (-pivot);

  if (pos > neg) {
    pivot = -pivot;
    swap (pos, neg);
  }
  LOG ("pivot %d occurs positively %" PRId64
       " times and negatively %" PRId64 " times",
       pivot, pos, neg);
  assert (!eliminator.schedule.contains (abs (pivot)));
  assert (pos <= neg);

  if (pos && neg > opts.elimocclim) {
    LOG ("too many occurrences thus not eliminated %d", pivot);
    assert (!eliminator.schedule.contains (abs (pivot)));
    return;
  }

  LOG ("trying to eliminate %d", pivot);
  assert (!flags (pivot).eliminated ());

  // Sort occurrence lists, such that shorter clauses come first.
  Occs &ps = occs (pivot);
  stable_sort (ps.begin (), ps.end (), clause_smaller_size ());
  Occs &ns = occs (-pivot);
  stable_sort (ns.begin (), ns.end (), clause_smaller_size ());

  if (pos)
    find_gate_clauses (eliminator, pivot);

  if (!unsat && !val (pivot)) {
    if (elim_resolvents_are_bounded (eliminator, pivot)) {
      LOG ("number of resolvents on %d are bounded", pivot);
      elim_add_resolvents (eliminator, pivot);
      if (!unsat)
        mark_eliminated_clauses_as_garbage (eliminator, pivot,
                                            deleted_binary_clause);
      if (active (pivot))
        mark_eliminated (pivot);
    } else
      LOG ("too many resolvents on %d so not eliminated", pivot);
  }

  unmark_gate_clauses (eliminator);
  elim_backward_clauses (eliminator);
}